

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

void __thiscall
proto2_unittest::TestAllTypes::unsafe_arena_set_allocated_optional_nested_message
          (TestAllTypes *this,TestAllTypes_NestedMessage *value)

{
  TestAllTypes_NestedMessage *pTVar1;
  ulong uVar2;
  
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if ((uVar2 == 0) &&
     (pTVar1 = (this->field_0)._impl_.optional_nested_message_,
     pTVar1 != (TestAllTypes_NestedMessage *)0x0)) {
    (*(pTVar1->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  (this->field_0)._impl_.optional_nested_message_ = value;
  (this->field_0)._impl_._has_bits_.has_bits_[0] =
       (uint)(value != (TestAllTypes_NestedMessage *)0x0) << 5 |
       (this->field_0)._impl_._has_bits_.has_bits_[0] & 0xffffffdf;
  return;
}

Assistant:

TestAllTypes::unsafe_arena_set_allocated_optional_nested_message(
    ::proto2_unittest::TestAllTypes_NestedMessage* PROTOBUF_NULLABLE value) {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (GetArena() == nullptr) {
    delete reinterpret_cast<::google::protobuf::MessageLite*>(_impl_.optional_nested_message_);
  }
  _impl_.optional_nested_message_ = reinterpret_cast<::proto2_unittest::TestAllTypes_NestedMessage*>(value);
  if (value != nullptr) {
    _impl_._has_bits_[0] |= 0x00000020u;
  } else {
    _impl_._has_bits_[0] &= ~0x00000020u;
  }
  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:proto2_unittest.TestAllTypes.optional_nested_message)
}